

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O3

void __thiscall FM::OPNA::SetReg(OPNA *this,uint addr,uint data)

{
  uint addr_00;
  byte bVar1;
  uint uVar2;
  
  uVar2 = addr & 0x1ff;
  if (uVar2 < 0x29) {
    bVar1 = (byte)data;
    if (uVar2 - 0x18 < 6) {
      uVar2 = (addr & 7) << 5;
      (&this->rhythm[0].pan)[uVar2] = bVar1 >> 6;
      (&this->rhythm[0].level)[uVar2] = ~bVar1 & 0x1f;
      return;
    }
    if (uVar2 == 0x10) {
      if ((char)bVar1 < '\0') {
        this->rhythmkey = this->rhythmkey & ~bVar1;
      }
      else {
        this->rhythmkey = this->rhythmkey | bVar1 & 0x3f;
        if ((data & 1) != 0) {
          this->rhythm[0].pos = 0;
        }
        if ((data & 2) != 0) {
          this->rhythm[1].pos = 0;
        }
        if ((data & 4) != 0) {
          this->rhythm[2].pos = 0;
        }
        if ((data & 8) != 0) {
          this->rhythm[3].pos = 0;
        }
        if ((data & 0x10) != 0) {
          this->rhythm[4].pos = 0;
        }
        if ((data & 0x20) != 0) {
          this->rhythm[5].pos = 0;
          return;
        }
      }
      return;
    }
    if (uVar2 == 0x11) {
      this->rhythmtl = ~bVar1 & 0x3f;
      return;
    }
  }
  else {
    addr_00 = uVar2 - 0x100;
    if ((addr_00 < 0x11) && ((0x13f3fU >> (addr_00 & 0x1f) & 1) != 0)) {
      OPNABase::SetADPCMBReg(&this->super_OPNABase,addr_00,data);
      return;
    }
    if (uVar2 == 0x29) {
      (this->super_OPNABase).reg29 = data;
      return;
    }
  }
  OPNABase::SetReg(&this->super_OPNABase,uVar2,data);
  return;
}

Assistant:

void OPNA::SetReg(uint addr, uint data)
{
	addr &= 0x1ff;

	switch (addr)
	{
	case 0x29:
		reg29 = data;
//		UpdateStatus(); //?
		break;

	// Rhythm ----------------------------------------------------------------
	case 0x10:			// DM/KEYON
		if (!(data & 0x80))  // KEY ON
		{
			rhythmkey |= data & 0x3f;
			if (data & 0x01) rhythm[0].pos = 0;
			if (data & 0x02) rhythm[1].pos = 0;
			if (data & 0x04) rhythm[2].pos = 0;
			if (data & 0x08) rhythm[3].pos = 0;
			if (data & 0x10) rhythm[4].pos = 0;
			if (data & 0x20) rhythm[5].pos = 0;
		}
		else
		{					// DUMP
			rhythmkey &= ~data;
		}
		break;

	case 0x11:
		rhythmtl = ~data & 63;
		break;

	case 0x18: 		// Bass Drum
	case 0x19:		// Snare Drum
	case 0x1a:		// Top Cymbal
	case 0x1b:		// Hihat
	case 0x1c:		// Tom-tom
	case 0x1d:		// Rim shot
		rhythm[addr & 7].pan   = (data >> 6) & 3;
		rhythm[addr & 7].level = ~data & 31;
		break;

	case 0x100: case 0x101:
	case 0x102: case 0x103:
	case 0x104: case 0x105:
	case 0x108:	case 0x109:
	case 0x10a:	case 0x10b:
	case 0x10c:	case 0x10d:
	case 0x110:
		OPNABase::SetADPCMBReg(addr - 0x100, data);
		break;

	default:
		OPNABase::SetReg(addr, data);
		break;
	}
}